

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

Expression * wasm::I64Utilities::getI64High(Builder *builder,Index index)

{
  LocalGet *left;
  Const *right;
  Binary *value;
  Unary *pUVar1;
  
  left = Builder::makeLocalGet(builder,index,(Type)0x3);
  right = Builder::makeConst<long>(builder,0x20);
  value = Builder::makeBinary(builder,ShrUInt64,(Expression *)left,(Expression *)right);
  pUVar1 = Builder::makeUnary(builder,WrapInt64,(Expression *)value);
  return (Expression *)pUVar1;
}

Assistant:

static Expression* getI64High(Builder& builder, Index index) {
    return builder.makeUnary(
      WrapInt64,
      builder.makeBinary(ShrUInt64,
                         builder.makeLocalGet(index, Type::i64),
                         builder.makeConst(int64_t(32))));
  }